

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
::_negative_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
  *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ID_index IVar5;
  Dimension DVar6;
  long lVar7;
  pointer puVar8;
  long lVar9;
  bool bVar10;
  Pos_index PVar11;
  Pos_index PVar12;
  long lVar13;
  long lVar14;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
  *pIVar15;
  long lVar16;
  ulong uVar17;
  anon_class_1_0_00000001 local_54;
  anon_class_1_0_00000001 local_53;
  anon_class_1_0_00000001 local_52;
  anon_class_1_0_00000001 local_51;
  ulong local_50;
  ulong local_48;
  anon_class_8_1_e4bd5e45 local_40;
  Index local_34;
  
  lVar7 = *(long *)&this[1].super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                    .nextPosition_;
  local_48 = CONCAT44(local_48._4_4_,columnIndex2);
  lVar14 = (ulong)columnIndex1 * 0x30;
  local_50 = (ulong)*(uint *)(lVar7 + 8 + lVar14);
  lVar16 = (ulong)columnIndex2 * 0x30;
  uVar17 = (ulong)*(uint *)(lVar7 + 8 + lVar16);
  local_34 = columnIndex1;
  PVar11 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
           ::birth(&this->super_type,*(ID_index *)(lVar7 + 4 + lVar14));
  PVar12 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
           ::birth(&this->super_type,*(ID_index *)(lVar7 + 4 + lVar16));
  uVar2 = *(uint *)(lVar7 + 4 + lVar14);
  uVar3 = *(uint *)(lVar7 + 4 + lVar16);
  puVar8 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = puVar8[uVar2];
  puVar8[uVar2] = puVar8[uVar3];
  puVar8[uVar3] = uVar4;
  lVar9 = *(long *)&this[1].super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                    .nextPosition_;
  if (PVar11 < PVar12) {
    lVar13 = uVar17 * 0x30;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
              *)(lVar9 + lVar13);
    local_48 = (ulong)*(uint *)(lVar9 + 4 + lVar13);
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
               *)(local_50 * 0x30 + lVar9);
    local_40.targetColumn = pIVar1;
    bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                       (pIVar15,pIVar1,&local_51,&local_40,&local_52,&local_53,&local_54);
    if (bVar10) {
      IVar5 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar5;
      DVar6 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_;
      (pIVar15->super_Column_dimension_option).dim_ = DVar6;
    }
    uVar2 = (pIVar1->super_Chain_column_option).pivot_;
    if ((uint)local_48 != uVar2) {
      puVar8 = this[1].super_type.pivotToPosition_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      uVar3 = puVar8[local_48];
      puVar8[local_48] = puVar8[uVar2];
      puVar8[uVar2] = uVar3;
    }
    lVar9 = *(long *)&this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                      .nextPosition_;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
              *)(lVar9 + lVar16);
    local_50 = (ulong)*(uint *)(lVar9 + 4 + lVar16);
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
               *)(lVar9 + lVar14);
    local_40.targetColumn = pIVar1;
    bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                       (pIVar15,pIVar1,&local_51,&local_40,&local_52,&local_53,&local_54);
    if (bVar10) {
      IVar5 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar5;
      DVar6 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_;
      (pIVar15->super_Column_dimension_option).dim_ = DVar6;
    }
    uVar2 = (pIVar1->super_Chain_column_option).pivot_;
    if ((uint)local_50 != uVar2) {
      puVar8 = this[1].super_type.pivotToPosition_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      uVar3 = puVar8[local_50];
      puVar8[local_50] = puVar8[uVar2];
      puVar8[uVar2] = uVar3;
    }
    Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
    ::negative_transpose
              (&this->super_type,*(ID_index *)(lVar14 + 4 + lVar7),*(ID_index *)(lVar16 + lVar7 + 4)
              );
  }
  else {
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
              *)(lVar9 + local_50 * 0x30);
    local_50 = (ulong)*(uint *)(lVar9 + 4 + local_50 * 0x30);
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
               *)(uVar17 * 0x30 + lVar9);
    local_40.targetColumn = pIVar1;
    bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                       (pIVar15,pIVar1,&local_51,&local_40,&local_52,&local_53,&local_54);
    if (bVar10) {
      IVar5 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar5;
      DVar6 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_;
      (pIVar15->super_Column_dimension_option).dim_ = DVar6;
    }
    uVar2 = (pIVar1->super_Chain_column_option).pivot_;
    if ((uint)local_50 != uVar2) {
      puVar8 = this[1].super_type.pivotToPosition_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      uVar3 = puVar8[local_50];
      puVar8[local_50] = puVar8[uVar2];
      puVar8[uVar2] = uVar3;
    }
    lVar7 = *(long *)&this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
                      .nextPosition_;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
              *)(lVar7 + lVar14);
    uVar2 = *(uint *)(lVar7 + 4 + lVar14);
    pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false>_>_>
               *)(lVar16 + lVar7);
    local_40.targetColumn = pIVar1;
    bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,true,false,false,false>>__Matrix_column_tag_1u>_false>___1_>
                       (pIVar15,pIVar1,&local_51,&local_40,&local_52,&local_53,&local_54);
    if (bVar10) {
      IVar5 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
      (pIVar15->super_Chain_column_option).pivot_ = IVar5;
      DVar6 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_;
      (pIVar15->super_Column_dimension_option).dim_ = DVar6;
    }
    uVar3 = (pIVar1->super_Chain_column_option).pivot_;
    if (uVar2 != uVar3) {
      puVar8 = this[1].super_type.pivotToPosition_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      uVar4 = puVar8[uVar2];
      puVar8[uVar2] = puVar8[uVar3];
      puVar8[uVar3] = uVar4;
    }
    local_34 = (Index)local_48;
  }
  return local_34;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_negative_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  Index pairedIndex1 = col1.get_paired_chain_index();
  Index pairedIndex2 = col2.get_paired_chain_index();

  bool hasSmallerBirth;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    hasSmallerBirth = (CP::birth(col1.get_pivot()) < CP::birth(col2.get_pivot()));
  } else {
    hasSmallerBirth = birthComp_(pairedIndex1, pairedIndex2);
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }

  if (hasSmallerBirth)
  {
    _matrix()->add_to(pairedIndex1, pairedIndex2);
    _matrix()->add_to(columnIndex1, columnIndex2);

    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::negative_transpose(col1.get_pivot(), col2.get_pivot());
    }

    return columnIndex1;
  }

  _matrix()->add_to(pairedIndex2, pairedIndex1);
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}